

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

ProStringList * __thiscall
QMakeEvaluator::split_value_list(QMakeEvaluator *this,QStringView vals,int source)

{
  bool bVar1;
  char16_t cVar2;
  const_pointer pvVar3;
  qsizetype qVar4;
  ProStringList *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  char16_t next;
  char16_t unicode;
  int x;
  bool hadWord;
  char16_t quote;
  int vals_len;
  QChar *vals_data;
  ProStringList *ret;
  QString build;
  QMakeEvaluator *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  ProStringList *pPVar5;
  char16_t local_ce;
  int local_cc;
  char16_t local_c6;
  int local_b4;
  ProString local_a0;
  QChar local_6c;
  QChar local_6a;
  ProString local_68;
  QChar local_32;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  pPVar5 = in_RDI;
  QString::QString((QString *)0x2efb4c);
  (in_RDI->super_QList<ProString>).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->super_QList<ProString>).d.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->super_QList<ProString>).d.size = -0x5555555555555556;
  ProStringList::ProStringList((ProStringList *)0x2efb7b);
  local_b4 = in_R8D;
  if (in_R8D == 0) {
    local_b4 = currentFileId(in_stack_ffffffffffffff08);
  }
  pvVar3 = QStringView::data(&local_18);
  qVar4 = QStringView::size(&local_18);
  local_c6 = L'\0';
  bVar1 = false;
  local_cc = 0;
  do {
    if ((int)qVar4 <= local_cc) {
      if (bVar1) {
        ProString::ProString
                  ((ProString *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (QString *)in_stack_ffffffffffffff08);
        ProString::setSource(&local_a0,local_b4);
        ProStringList::operator<<
                  ((ProStringList *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (ProString *)in_stack_ffffffffffffff08);
        ProString::~ProString((ProString *)0x2efe0c);
      }
      QString::~QString((QString *)0x2efe2f);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return pPVar5;
      }
      __stack_chk_fail();
    }
    local_ce = QChar::unicode(pvVar3 + local_cc);
    if (local_ce == local_c6) {
      local_c6 = L'\0';
      bVar1 = true;
      QChar::QChar<char16_t,_true>(&local_32,local_ce);
      QString::operator+=((QString *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          (QChar)(char16_t)((ulong)pPVar5 >> 0x30));
    }
    else {
      in_stack_ffffffffffffff14 = (uint)(ushort)local_ce;
      if ((in_stack_ffffffffffffff14 == 9) || (in_stack_ffffffffffffff14 == 0x20)) {
        if (local_c6 == L'\0') {
          if (bVar1) {
            ProString::ProString
                      ((ProString *)(ulong)CONCAT24(local_ce,in_stack_ffffffffffffff10),
                       (QString *)in_stack_ffffffffffffff08);
            ProString::setSource(&local_68,local_b4);
            ProStringList::operator<<
                      ((ProStringList *)
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (ProString *)in_stack_ffffffffffffff08);
            ProString::~ProString((ProString *)0x2efce3);
            QString::clear((QString *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10))
            ;
            bVar1 = false;
          }
          goto LAB_002efdbe;
        }
      }
      else if ((in_stack_ffffffffffffff14 == 0x22) || (in_stack_ffffffffffffff14 == 0x27)) {
        if (local_c6 == L'\0') {
          local_c6 = local_ce;
        }
        bVar1 = true;
      }
      else {
        if ((in_stack_ffffffffffffff14 == 0x5c) && (local_cc + 1 != (int)qVar4)) {
          cVar2 = QChar::unicode(pvVar3 + (local_cc + 1));
          if ((cVar2 == L'\'') || ((cVar2 == L'\"' || (cVar2 == L'\\')))) {
            QChar::QChar<char16_t,_true>(&local_6a,local_ce);
            QString::operator+=((QString *)
                                CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                (QChar)(char16_t)((ulong)pPVar5 >> 0x30));
            local_ce = cVar2;
            local_cc = local_cc + 1;
          }
        }
        bVar1 = true;
      }
      QChar::QChar<char16_t,_true>(&local_6c,local_ce);
      QString::operator+=((QString *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          (QChar)(char16_t)((ulong)pPVar5 >> 0x30));
    }
LAB_002efdbe:
    local_cc = local_cc + 1;
  } while( true );
}

Assistant:

ProStringList QMakeEvaluator::split_value_list(QStringView vals, int source)
{
    QString build;
    ProStringList ret;

    if (!source)
        source = currentFileId();

    const QChar *vals_data = vals.data();
    const int vals_len = vals.size();
    char16_t quote = 0;
    bool hadWord = false;
    for (int x = 0; x < vals_len; x++) {
        char16_t unicode = vals_data[x].unicode();
        if (unicode == quote) {
            quote = 0;
            hadWord = true;
            build += QChar(unicode);
            continue;
        }
        switch (unicode) {
        case '"':
        case '\'':
            if (!quote)
                quote = unicode;
            // FIXME: this is inconsistent with the "there are no empty strings" dogma.
            hadWord = true;
            break;
        case ' ':
        case '\t':
            if (!quote) {
                if (hadWord) {
                    ret << ProString(build).setSource(source);
                    build.clear();
                    hadWord = false;
                }
                continue;
            }
            break;
        case '\\':
            if (x + 1 != vals_len) {
                char16_t next = vals_data[++x].unicode();
                if (next == '\'' || next == '"' || next == '\\') {
                    build += QChar(unicode);
                    unicode = next;
                } else {
                    --x;
                }
            }
            Q_FALLTHROUGH();
        default:
            hadWord = true;
            break;
        }
        build += QChar(unicode);
    }
    if (hadWord)
        ret << ProString(build).setSource(source);
    return ret;
}